

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

void Acb_IntallLibrary(void)

{
  Vec_Str_t *p;
  Mio_Library_t *pLib;
  char *pName;
  char **ppcVar1;
  
  p = Vec_StrAlloc(1000);
  for (ppcVar1 = pLibStr; *ppcVar1 != (char *)0x0; ppcVar1 = ppcVar1 + 1) {
    Vec_StrAppend(p,*ppcVar1);
  }
  Vec_StrPush(p,'\0');
  pLib = Mio_LibraryReadBuffer(p->pArray,0,(st__table *)0x0,0);
  pName = Abc_UtilStrsav("iccad17.genlib");
  Mio_LibrarySetName(pLib,pName);
  Mio_UpdateGenlib(pLib);
  Vec_StrFree(p);
  return;
}

Assistant:

void Acb_IntallLibrary()
{
    extern Mio_Library_t * Mio_LibraryReadBuffer( char * pBuffer, int fExtendedFormat, st__table * tExcludeGate, int fVerbose );
    Mio_Library_t * pLib;
    int i;
    // create library string
    Vec_Str_t * vLibStr = Vec_StrAlloc( 1000 );
    for ( i = 0; pLibStr[i]; i++ )
        Vec_StrAppend( vLibStr, pLibStr[i] );
    Vec_StrPush( vLibStr, '\0' );
    // create library
    pLib = Mio_LibraryReadBuffer( Vec_StrArray(vLibStr), 0, NULL, 0 );
    Mio_LibrarySetName( pLib, Abc_UtilStrsav("iccad17.genlib") );
    Mio_UpdateGenlib( pLib );
    Vec_StrFree( vLibStr );
}